

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

archive_vtable_conflict * archive_write_disk_vtable(void)

{
  if (archive_write_disk_vtable::inited == L'\0') {
    archive_write_disk_vtable::av.archive_close = _archive_write_disk_close;
    archive_write_disk_vtable::av.archive_filter_bytes = _archive_write_disk_filter_bytes;
    archive_write_disk_vtable::av.archive_free = _archive_write_disk_free;
    archive_write_disk_vtable::av.archive_write_header = _archive_write_disk_header;
    archive_write_disk_vtable::av.archive_write_finish_entry = _archive_write_disk_finish_entry;
    archive_write_disk_vtable::av.archive_write_data = _archive_write_disk_data;
    archive_write_disk_vtable::av.archive_write_data_block = _archive_write_disk_data_block;
    archive_write_disk_vtable::inited = L'\x01';
  }
  return &archive_write_disk_vtable::av;
}

Assistant:

static struct archive_vtable *
archive_write_disk_vtable(void)
{
	static struct archive_vtable av;
	static int inited = 0;

	if (!inited) {
		av.archive_close = _archive_write_disk_close;
		av.archive_filter_bytes = _archive_write_disk_filter_bytes;
		av.archive_free = _archive_write_disk_free;
		av.archive_write_header = _archive_write_disk_header;
		av.archive_write_finish_entry
		    = _archive_write_disk_finish_entry;
		av.archive_write_data = _archive_write_disk_data;
		av.archive_write_data_block = _archive_write_disk_data_block;
		inited = 1;
	}
	return (&av);
}